

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void glfwSetCursorPos(GLFWwindow *handle,double xpos,double ypos)

{
  _GLFWwindow *window;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (_glfw.focusedWindow == (_GLFWwindow *)handle) {
    if ((*(double *)(handle + 0x40) == xpos) && (!NAN(*(double *)(handle + 0x40)) && !NAN(xpos))) {
      if ((*(double *)(handle + 0x48) == ypos) && (!NAN(*(double *)(handle + 0x48)) && !NAN(ypos)))
      {
        return;
      }
    }
    *(double *)(handle + 0x40) = xpos;
    *(double *)(handle + 0x48) = ypos;
    if (*(int *)(handle + 0x50) != 0x34003) {
      *(int *)(handle + 0x280) = (int)xpos;
      *(int *)(handle + 0x284) = (int)ypos;
      XWarpPointer(_glfw.x11.display,0,*(undefined8 *)(handle + 0x250),0,0,0,0,(int)xpos,(int)ypos);
      return;
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetCursorPos(GLFWwindow* handle, double xpos, double ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    if (_glfw.focusedWindow != window)
        return;

    // Don't do anything if the cursor position did not change
    if (xpos == window->cursorPosX && ypos == window->cursorPosY)
        return;

    // Set GLFW cursor position
    window->cursorPosX = xpos;
    window->cursorPosY = ypos;

    // Do not move physical cursor if it is disabled
    if (window->cursorMode == GLFW_CURSOR_DISABLED)
        return;

    // Update physical cursor position
    _glfwPlatformSetCursorPos(window, xpos, ypos);
}